

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O1

void __thiscall
SQCompilation::RenderVisitor::visitGetSlotExpr(RenderVisitor *this,GetSlotExpr *expr)

{
  Node::visit<SQCompilation::RenderVisitor>
            (&((expr->super_SlotAccessExpr).super_AccessExpr._receiver)->super_Node,this);
  if ((expr->super_SlotAccessExpr).super_AccessExpr._nullable == true) {
    OutputStream::writeChar(this->_out,'?');
  }
  OutputStream::writeChar(this->_out,'[');
  Node::visit<SQCompilation::RenderVisitor>(&((expr->super_SlotAccessExpr)._key)->super_Node,this);
  OutputStream::writeChar(this->_out,']');
  return;
}

Assistant:

virtual void visitGetSlotExpr(GetSlotExpr *expr) {
        expr->receiver()->visit(this);
        if (expr->isNullable()) _out->writeChar('?');
        _out->writeChar('[');
        expr->key()->visit(this);
        _out->writeChar(']');
    }